

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListShiftJoinType(SrcList *p)

{
  int iVar1;
  int local_14;
  int i;
  SrcList *p_local;
  
  if (p != (SrcList *)0x0) {
    iVar1 = (int)p->nSrc;
    while (local_14 = iVar1 + -1, 0 < local_14) {
      p->a[local_14].jointype = p->a[iVar1 + -2].jointype;
      iVar1 = local_14;
    }
    p->a[0].jointype = '\0';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListShiftJoinType(SrcList *p){
  if( p ){
    int i;
    assert( p->a || p->nSrc==0 );
    for(i=p->nSrc-1; i>0; i--){
      p->a[i].jointype = p->a[i-1].jointype;
    }
    p->a[0].jointype = 0;
  }
}